

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_double_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_fe *rzr)

{
  uint64_t *puVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  secp256k1_fe t1;
  secp256k1_fe local_e8;
  secp256k1_fe local_b8;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  iVar2 = a->infinity;
  r->infinity = iVar2;
  if (iVar2 == 0) {
    if (rzr != (secp256k1_fe *)0x0) {
      rzr->n[4] = (a->y).n[4];
      uVar3 = (a->y).n[0];
      uVar4 = (a->y).n[1];
      uVar5 = (a->y).n[3];
      rzr->n[2] = (a->y).n[2];
      rzr->n[3] = uVar5;
      rzr->n[0] = uVar3;
      rzr->n[1] = uVar4;
      secp256k1_fe_normalize_weak(rzr);
      uVar3 = rzr->n[1];
      uVar4 = rzr->n[2];
      uVar5 = rzr->n[3];
      rzr->n[0] = rzr->n[0] * 2;
      rzr->n[1] = uVar3 * 2;
      rzr->n[2] = uVar4 * 2;
      rzr->n[3] = uVar5 * 2;
      rzr->n[4] = rzr->n[4] << 1;
    }
    secp256k1_fe_mul(&r->z,&a->z,&a->y);
    uVar3 = (r->z).n[1];
    uVar4 = (r->z).n[2];
    uVar5 = (r->z).n[3];
    (r->z).n[0] = (r->z).n[0] * 2;
    (r->z).n[1] = uVar3 * 2;
    (r->z).n[2] = uVar4 * 2;
    (r->z).n[3] = uVar5 * 2;
    puVar1 = (r->z).n + 4;
    *puVar1 = *puVar1 << 1;
    secp256k1_fe_sqr(&local_58,&a->x);
    local_58.n[0] = local_58.n[0] * 3;
    local_58.n[1] = local_58.n[1] * 3;
    local_58.n[2] = local_58.n[2] * 3;
    local_58.n[3] = local_58.n[3] * 3;
    local_58.n[4] = local_58.n[4] * 3;
    secp256k1_fe_sqr(&local_88,&local_58);
    secp256k1_fe_sqr(&local_b8,&a->y);
    local_b8.n[0] = local_b8.n[0] * 2;
    local_b8.n[1] = local_b8.n[1] * 2;
    local_b8.n[2] = local_b8.n[2] * 2;
    local_b8.n[3] = local_b8.n[3] * 2;
    local_b8.n[4] = local_b8.n[4] << 1;
    secp256k1_fe_sqr(&local_e8,&local_b8);
    secp256k1_fe_mul(&local_b8,&local_b8,&a->x);
    (r->x).n[0] = local_b8.n[0];
    (r->x).n[1] = local_b8.n[1];
    (r->x).n[4] = local_b8.n[4];
    (r->x).n[2] = local_b8.n[2];
    (r->x).n[3] = local_b8.n[3];
    uVar3 = (r->x).n[1];
    (r->x).n[0] = local_88.n[0] + (r->x).n[0] * -4 + 0x9ffff5ffffd9d6;
    (r->x).n[1] = local_88.n[1] + uVar3 * -4 + 0x9ffffffffffff6;
    uVar3 = (r->x).n[3];
    (r->x).n[2] = local_88.n[2] + (r->x).n[2] * -4 + 0x9ffffffffffff6;
    (r->x).n[3] = local_88.n[3] + uVar3 * -4 + 0x9ffffffffffff6;
    (r->x).n[4] = local_88.n[4] + local_b8.n[4] * -4 + 0x9fffffffffff6;
    local_b8.n[0] =
         ((((local_b8.n[0] >> 0x20) * 6 << 0x20) + (local_b8.n[0] & 0xffffffff) * 6) - local_88.n[0]
         ) + 0x3ffffbfffff0bc;
    local_b8.n[1] =
         ((((local_b8.n[1] >> 0x20) * 6 << 0x20) + (local_b8.n[1] & 0xffffffff) * 6) - local_88.n[1]
         ) + 0x3ffffffffffffc;
    local_b8.n[2] =
         ((((local_b8.n[2] >> 0x20) * 6 << 0x20) + (local_b8.n[2] & 0xffffffff) * 6) - local_88.n[2]
         ) + 0x3ffffffffffffc;
    local_b8.n[3] =
         ((((local_b8.n[3] >> 0x20) * 6 << 0x20) + (local_b8.n[3] & 0xffffffff) * 6) - local_88.n[3]
         ) + 0x3ffffffffffffc;
    local_b8.n[4] = (local_b8.n[4] * 6 - local_88.n[4]) + 0x3fffffffffffc;
    secp256k1_fe_mul(&r->y,&local_58,&local_b8);
    uVar3 = (r->y).n[1];
    uVar4 = (r->y).n[2];
    uVar5 = (r->y).n[3];
    (r->y).n[0] = (r->y).n[0] + local_e8.n[0] * -2 + 0x5ffff9ffffe91a;
    (r->y).n[1] = uVar3 + local_e8.n[1] * -2 + 0x5ffffffffffffa;
    (r->y).n[2] = uVar4 + local_e8.n[2] * -2 + 0x5ffffffffffffa;
    (r->y).n[3] = uVar5 + local_e8.n[3] * -2 + 0x5ffffffffffffa;
    (r->y).n[4] = (r->y).n[4] + local_e8.n[4] * -2 + 0x5fffffffffffa;
  }
  else if (rzr != (secp256k1_fe *)0x0) {
    rzr->n[0] = 1;
    rzr->n[1] = 0;
    rzr->n[2] = 0;
    rzr->n[3] = 0;
    rzr->n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_double_var(secp256k1_gej *r, const secp256k1_gej *a, secp256k1_fe *rzr) {
    /* Operations: 3 mul, 4 sqr, 0 normalize, 12 mul_int/add/negate.
     *
     * Note that there is an implementation described at
     *     https://hyperelliptic.org/EFD/g1p/auto-shortw-jacobian-0.html#doubling-dbl-2009-l
     * which trades a multiply for a square, but in practice this is actually slower,
     * mainly because it requires more normalizations.
     */
    secp256k1_fe t1,t2,t3,t4;
    /** For secp256k1, 2Q is infinity if and only if Q is infinity. This is because if 2Q = infinity,
     *  Q must equal -Q, or that Q.y == -(Q.y), or Q.y is 0. For a point on y^2 = x^3 + 7 to have
     *  y=0, x^3 must be -7 mod p. However, -7 has no cube root mod p.
     *
     *  Having said this, if this function receives a point on a sextic twist, e.g. by
     *  a fault attack, it is possible for y to be 0. This happens for y^2 = x^3 + 6,
     *  since -6 does have a cube root mod p. For this point, this function will not set
     *  the infinity flag even though the point doubles to infinity, and the result
     *  point will be gibberish (z = 0 but infinity = 0).
     */
    r->infinity = a->infinity;
    if (r->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        return;
    }

    if (rzr != NULL) {
        *rzr = a->y;
        secp256k1_fe_normalize_weak(rzr);
        secp256k1_fe_mul_int(rzr, 2);
    }

    secp256k1_fe_mul(&r->z, &a->z, &a->y);
    secp256k1_fe_mul_int(&r->z, 2);       /* Z' = 2*Y*Z (2) */
    secp256k1_fe_sqr(&t1, &a->x);
    secp256k1_fe_mul_int(&t1, 3);         /* T1 = 3*X^2 (3) */
    secp256k1_fe_sqr(&t2, &t1);           /* T2 = 9*X^4 (1) */
    secp256k1_fe_sqr(&t3, &a->y);
    secp256k1_fe_mul_int(&t3, 2);         /* T3 = 2*Y^2 (2) */
    secp256k1_fe_sqr(&t4, &t3);
    secp256k1_fe_mul_int(&t4, 2);         /* T4 = 8*Y^4 (2) */
    secp256k1_fe_mul(&t3, &t3, &a->x);    /* T3 = 2*X*Y^2 (1) */
    r->x = t3;
    secp256k1_fe_mul_int(&r->x, 4);       /* X' = 8*X*Y^2 (4) */
    secp256k1_fe_negate(&r->x, &r->x, 4); /* X' = -8*X*Y^2 (5) */
    secp256k1_fe_add(&r->x, &t2);         /* X' = 9*X^4 - 8*X*Y^2 (6) */
    secp256k1_fe_negate(&t2, &t2, 1);     /* T2 = -9*X^4 (2) */
    secp256k1_fe_mul_int(&t3, 6);         /* T3 = 12*X*Y^2 (6) */
    secp256k1_fe_add(&t3, &t2);           /* T3 = 12*X*Y^2 - 9*X^4 (8) */
    secp256k1_fe_mul(&r->y, &t1, &t3);    /* Y' = 36*X^3*Y^2 - 27*X^6 (1) */
    secp256k1_fe_negate(&t2, &t4, 2);     /* T2 = -8*Y^4 (3) */
    secp256k1_fe_add(&r->y, &t2);         /* Y' = 36*X^3*Y^2 - 27*X^6 - 8*Y^4 (4) */
}